

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O1

optional<pbrt::ShapeSample> * __thiscall
pbrt::BilinearPatch::Sample
          (optional<pbrt::ShapeSample> *__return_storage_ptr__,BilinearPatch *this,
          ShapeSampleContext *ctx,Point2f u)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  Point3f *s;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  int iVar11;
  int iVar12;
  char *pcVar13;
  long lVar14;
  long lVar15;
  bool bVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  bool bVar32;
  long lVar33;
  Tuple3<pbrt::Vector3,_float> *ey;
  long lVar35;
  ulong uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  Float FVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar68 [56];
  undefined1 auVar67 [64];
  undefined4 uVar77;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined4 uVar78;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar79;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  Point3f PVar96;
  Float quadPDF;
  optional<pbrt::ShapeSample> ss;
  Tuple2<pbrt::Point2,_float> local_210;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  float local_1d8;
  undefined4 uStack_1d4;
  undefined8 uStack_1d0;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  Tuple3<pbrt::Vector3,_float> local_1a8;
  Tuple3<pbrt::Vector3,_float> local_198;
  Tuple3<pbrt::Vector3,_float> local_188;
  Tuple3<pbrt::Vector3,_float> local_178;
  float local_16c;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  aligned_storage_t<sizeof(pbrt::ShapeSample),_alignof(pbrt::ShapeSample)> local_148;
  bool local_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  Tuple3<pbrt::Vector3,_float> local_50;
  Tuple3<pbrt::Vector3,_float> local_40;
  undefined4 uVar34;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  
  auVar62._8_56_ = in_register_00001208;
  auVar62._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  local_210 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar62._0_16_);
  pcVar13 = *(char **)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  lVar33 = (long)this->blpIndex * 0x10;
  lVar14 = *(long *)(pcVar13 + 0x10);
  lVar15 = *(long *)(pcVar13 + 0x18);
  lVar35 = (long)*(int *)(lVar14 + lVar33);
  pfVar1 = (float *)(lVar15 + (long)*(int *)(lVar14 + 4 + lVar33) * 0xc);
  iVar11 = *(int *)(lVar14 + 8 + lVar33);
  iVar12 = *(int *)(lVar14 + 0xc + lVar33);
  fVar46 = (*(float *)(ctx + 0x10) + *(float *)(ctx + 0x14)) * -0.5 +
           *(float *)(lVar15 + 8 + lVar35 * 0xc);
  auVar37 = vinsertps_avx(*(undefined1 (*) [16])ctx,ZEXT416(*(uint *)(ctx + 0xc)),0x10);
  auVar40._0_4_ = (float)*(undefined8 *)(ctx + 4) + auVar37._0_4_;
  auVar40._4_4_ = (float)((ulong)*(undefined8 *)(ctx + 4) >> 0x20) + auVar37._4_4_;
  auVar40._8_4_ = auVar37._8_4_ + 0.0;
  auVar40._12_4_ = auVar37._12_4_ + 0.0;
  auVar37._8_4_ = 0xbf000000;
  auVar37._0_8_ = 0xbf000000bf000000;
  auVar37._12_4_ = 0xbf000000;
  auVar37 = vmulps_avx512vl(auVar40,auVar37);
  uVar7 = *(undefined8 *)(lVar15 + lVar35 * 0xc);
  auVar39._0_4_ = (float)uVar7 + auVar37._0_4_;
  auVar39._4_4_ = (float)((ulong)uVar7 >> 0x20) + auVar37._4_4_;
  auVar39._8_4_ = auVar37._8_4_ + 0.0;
  auVar39._12_4_ = auVar37._12_4_ + 0.0;
  auVar38._0_4_ = auVar39._0_4_ * auVar39._0_4_;
  auVar38._4_4_ = auVar39._4_4_ * auVar39._4_4_;
  auVar38._8_4_ = auVar39._8_4_ * auVar39._8_4_;
  auVar38._12_4_ = auVar39._12_4_ * auVar39._12_4_;
  auVar37 = vmovshdup_avx(auVar38);
  auVar37 = vfmadd231ss_fma(auVar37,auVar39,auVar39);
  auVar37 = vfmadd231ss_fma(auVar37,ZEXT416((uint)fVar46),ZEXT416((uint)fVar46));
  if (auVar37._0_4_ < 0.0) {
    local_178.z = sqrtf(auVar37._0_4_);
  }
  else {
    auVar37 = vsqrtss_avx(auVar37,auVar37);
    local_178.z = auVar37._0_4_;
  }
  pfVar2 = (float *)(lVar15 + (long)iVar11 * 0xc);
  auVar69._4_4_ = local_178.z;
  auVar69._0_4_ = local_178.z;
  auVar69._8_4_ = local_178.z;
  auVar69._12_4_ = local_178.z;
  auVar37 = vdivps_avx(auVar39,auVar69);
  local_178.z = fVar46 / local_178.z;
  local_178._0_8_ = vmovlps_avx(auVar37);
  fVar46 = (*(float *)(ctx + 0x10) + *(float *)(ctx + 0x14)) * -0.5 + pfVar1[2];
  auVar37 = vinsertps_avx(*(undefined1 (*) [16])ctx,ZEXT416(*(uint *)(ctx + 0xc)),0x10);
  auVar47._0_4_ = (float)*(undefined8 *)(ctx + 4) + auVar37._0_4_;
  auVar47._4_4_ = (float)((ulong)*(undefined8 *)(ctx + 4) >> 0x20) + auVar37._4_4_;
  auVar47._8_4_ = auVar37._8_4_ + 0.0;
  auVar47._12_4_ = auVar37._12_4_ + 0.0;
  auVar91._8_4_ = 0xbf000000;
  auVar91._0_8_ = 0xbf000000bf000000;
  auVar91._12_4_ = 0xbf000000;
  auVar37 = vmulps_avx512vl(auVar47,auVar91);
  auVar84._0_4_ = (float)*(undefined8 *)pfVar1 + auVar37._0_4_;
  auVar84._4_4_ = (float)((ulong)*(undefined8 *)pfVar1 >> 0x20) + auVar37._4_4_;
  auVar84._8_4_ = auVar37._8_4_ + 0.0;
  auVar84._12_4_ = auVar37._12_4_ + 0.0;
  auVar48._0_4_ = auVar84._0_4_ * auVar84._0_4_;
  auVar48._4_4_ = auVar84._4_4_ * auVar84._4_4_;
  auVar48._8_4_ = auVar84._8_4_ * auVar84._8_4_;
  auVar48._12_4_ = auVar84._12_4_ * auVar84._12_4_;
  auVar37 = vmovshdup_avx(auVar48);
  auVar37 = vfmadd231ss_fma(auVar37,auVar84,auVar84);
  auVar37 = vfmadd231ss_fma(auVar37,ZEXT416((uint)fVar46),ZEXT416((uint)fVar46));
  if (auVar37._0_4_ < 0.0) {
    local_188.z = sqrtf(auVar37._0_4_);
  }
  else {
    auVar37 = vsqrtss_avx(auVar37,auVar37);
    local_188.z = auVar37._0_4_;
  }
  pfVar3 = (float *)(lVar15 + (long)iVar12 * 0xc);
  auVar70._4_4_ = local_188.z;
  auVar70._0_4_ = local_188.z;
  auVar70._8_4_ = local_188.z;
  auVar70._12_4_ = local_188.z;
  auVar37 = vdivps_avx(auVar84,auVar70);
  local_188.z = fVar46 / local_188.z;
  local_188._0_8_ = vmovlps_avx(auVar37);
  fVar46 = (*(float *)(ctx + 0x10) + *(float *)(ctx + 0x14)) * -0.5 + pfVar2[2];
  auVar37 = vinsertps_avx(*(undefined1 (*) [16])ctx,ZEXT416(*(uint *)(ctx + 0xc)),0x10);
  auVar49._0_4_ = (float)*(undefined8 *)(ctx + 4) + auVar37._0_4_;
  auVar49._4_4_ = (float)((ulong)*(undefined8 *)(ctx + 4) >> 0x20) + auVar37._4_4_;
  auVar49._8_4_ = auVar37._8_4_ + 0.0;
  auVar49._12_4_ = auVar37._12_4_ + 0.0;
  auVar21._8_4_ = 0xbf000000;
  auVar21._0_8_ = 0xbf000000bf000000;
  auVar21._12_4_ = 0xbf000000;
  auVar37 = vmulps_avx512vl(auVar49,auVar21);
  auVar85._0_4_ = (float)*(undefined8 *)pfVar2 + auVar37._0_4_;
  auVar85._4_4_ = (float)((ulong)*(undefined8 *)pfVar2 >> 0x20) + auVar37._4_4_;
  auVar85._8_4_ = auVar37._8_4_ + 0.0;
  auVar85._12_4_ = auVar37._12_4_ + 0.0;
  auVar50._0_4_ = auVar85._0_4_ * auVar85._0_4_;
  auVar50._4_4_ = auVar85._4_4_ * auVar85._4_4_;
  auVar50._8_4_ = auVar85._8_4_ * auVar85._8_4_;
  auVar50._12_4_ = auVar85._12_4_ * auVar85._12_4_;
  auVar37 = vmovshdup_avx(auVar50);
  auVar37 = vfmadd231ss_fma(auVar37,auVar85,auVar85);
  auVar37 = vfmadd231ss_fma(auVar37,ZEXT416((uint)fVar46),ZEXT416((uint)fVar46));
  if (auVar37._0_4_ < 0.0) {
    local_198.z = sqrtf(auVar37._0_4_);
  }
  else {
    auVar37 = vsqrtss_avx(auVar37,auVar37);
    local_198.z = auVar37._0_4_;
  }
  auVar71._4_4_ = local_198.z;
  auVar71._0_4_ = local_198.z;
  auVar71._8_4_ = local_198.z;
  auVar71._12_4_ = local_198.z;
  auVar37 = vdivps_avx(auVar85,auVar71);
  local_198.z = fVar46 / local_198.z;
  local_198._0_8_ = vmovlps_avx(auVar37);
  fVar46 = (*(float *)(ctx + 0x10) + *(float *)(ctx + 0x14)) * -0.5 + pfVar3[2];
  auVar37 = vinsertps_avx(*(undefined1 (*) [16])ctx,ZEXT416(*(uint *)(ctx + 0xc)),0x10);
  auVar51._0_4_ = (float)*(undefined8 *)(ctx + 4) + auVar37._0_4_;
  auVar51._4_4_ = (float)((ulong)*(undefined8 *)(ctx + 4) >> 0x20) + auVar37._4_4_;
  auVar51._8_4_ = auVar37._8_4_ + 0.0;
  auVar51._12_4_ = auVar37._12_4_ + 0.0;
  auVar22._8_4_ = 0xbf000000;
  auVar22._0_8_ = 0xbf000000bf000000;
  auVar22._12_4_ = 0xbf000000;
  auVar37 = vmulps_avx512vl(auVar51,auVar22);
  auVar86._0_4_ = (float)*(undefined8 *)pfVar3 + auVar37._0_4_;
  auVar86._4_4_ = (float)((ulong)*(undefined8 *)pfVar3 >> 0x20) + auVar37._4_4_;
  auVar86._8_4_ = auVar37._8_4_ + 0.0;
  auVar86._12_4_ = auVar37._12_4_ + 0.0;
  auVar52._0_4_ = auVar86._0_4_ * auVar86._0_4_;
  auVar52._4_4_ = auVar86._4_4_ * auVar86._4_4_;
  auVar52._8_4_ = auVar86._8_4_ * auVar86._8_4_;
  auVar52._12_4_ = auVar86._12_4_ * auVar86._12_4_;
  auVar37 = vmovshdup_avx(auVar52);
  auVar37 = vfmadd231ss_fma(auVar37,auVar86,auVar86);
  auVar37 = vfmadd231ss_fma(auVar37,ZEXT416((uint)fVar46),ZEXT416((uint)fVar46));
  if (auVar37._0_4_ < 0.0) {
    local_1a8.z = sqrtf(auVar37._0_4_);
  }
  else {
    auVar37 = vsqrtss_avx(auVar37,auVar37);
    local_1a8.z = auVar37._0_4_;
  }
  auVar72._4_4_ = local_1a8.z;
  auVar72._0_4_ = local_1a8.z;
  auVar72._8_4_ = local_1a8.z;
  auVar72._12_4_ = local_1a8.z;
  auVar37 = vdivps_avx(auVar86,auVar72);
  local_1a8.z = fVar46 / local_1a8.z;
  local_1a8._0_8_ = vmovlps_avx(auVar37);
  bVar32 = IsRectangle(this);
  if (((!bVar32) || (*(long *)(pcVar13 + 0x38) != 0)) ||
     (FVar42 = SphericalQuadArea((Vector3f *)&local_178,(Vector3f *)&local_188,
                                 (Vector3f *)&local_1a8,(Vector3f *)&local_198), FVar42 <= 0.0001))
  {
    Sample((optional<pbrt::ShapeSample> *)&local_148.__align,this,(Point2f)local_210);
    if (local_f0 == false) {
      LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
    }
    local_148._24_4_ = *(undefined4 *)(ctx + 0x30);
    fVar46 = ((float)local_148._0_4_ + (float)local_148._4_4_) * 0.5;
    auVar30._4_4_ = local_148._12_4_;
    auVar30._0_4_ = local_148._8_4_;
    auVar30._8_4_ = local_148._16_4_;
    auVar30._12_4_ = local_148._20_4_;
    fVar44 = fVar46 - (*(float *)ctx + *(float *)(ctx + 4)) * 0.5;
    auVar37 = vinsertps_avx(auVar30,ZEXT416((uint)local_148._20_4_),0x10);
    auVar92._0_4_ = ((float)local_148._12_4_ + auVar37._0_4_) * 0.5;
    auVar92._4_4_ = ((float)local_148._16_4_ + auVar37._4_4_) * 0.5;
    auVar92._8_4_ = (auVar37._8_4_ + 0.0) * 0.5;
    auVar92._12_4_ = (auVar37._12_4_ + 0.0) * 0.5;
    auVar37 = vinsertps_avx(*(undefined1 (*) [16])(ctx + 8),ZEXT416(*(uint *)(ctx + 0x14)),0x10);
    auVar53._0_4_ = ((float)*(undefined8 *)(ctx + 0xc) + auVar37._0_4_) * 0.5;
    auVar53._4_4_ = ((float)((ulong)*(undefined8 *)(ctx + 0xc) >> 0x20) + auVar37._4_4_) * 0.5;
    auVar53._8_4_ = (auVar37._8_4_ + 0.0) * 0.5;
    auVar53._12_4_ = (auVar37._12_4_ + 0.0) * 0.5;
    auVar40 = vsubps_avx(auVar92,auVar53);
    auVar37 = vmovshdup_avx(auVar40);
    auVar38 = vfmadd231ss_fma(ZEXT416((uint)(auVar40._0_4_ * auVar40._0_4_)),ZEXT416((uint)fVar44),
                              ZEXT416((uint)fVar44));
    auVar37 = vfmadd231ss_fma(auVar38,auVar37,auVar37);
    fVar43 = auVar37._0_4_;
    if ((fVar43 != 0.0) || (NAN(fVar43))) {
      if (fVar43 < 0.0) {
        fVar43 = sqrtf(fVar43);
      }
      else {
        auVar37 = vsqrtss_avx(auVar37,auVar37);
        fVar43 = auVar37._0_4_;
      }
      auVar81._0_8_ = auVar40._0_8_ ^ 0x8000000080000000;
      auVar81._8_4_ = auVar40._8_4_ ^ 0x80000000;
      auVar81._12_4_ = auVar40._12_4_ ^ 0x80000000;
      auVar54._4_4_ = fVar43;
      auVar54._0_4_ = fVar43;
      auVar54._8_4_ = fVar43;
      auVar54._12_4_ = fVar43;
      auVar37 = vdivps_avx(auVar81,auVar54);
      auVar82._4_4_ = local_148._48_4_;
      auVar82._0_4_ = local_148._44_4_;
      auVar82._8_8_ = 0;
      auVar87._0_4_ = auVar37._0_4_ * (float)local_148._44_4_;
      auVar87._4_4_ = auVar37._4_4_ * (float)local_148._48_4_;
      auVar87._8_4_ = auVar37._8_4_ * 0.0;
      auVar87._12_4_ = auVar37._12_4_ * 0.0;
      uVar36 = CONCAT44(auVar87._4_4_,auVar87._0_4_);
      auVar80._0_8_ = uVar36 ^ 0x8000000080000000;
      auVar80._8_4_ = -auVar87._8_4_;
      auVar80._12_4_ = -auVar87._12_4_;
      auVar40 = vpermi2ps_avx512vl(_DAT_00462ba0,auVar87,auVar80);
      auVar37 = vfmadd231ps_fma(auVar40,auVar82,auVar37);
      auVar37 = vhaddps_avx(auVar37,auVar37);
      auVar37 = vfnmadd231ss_fma(auVar37,ZEXT416((uint)(fVar44 / fVar43)),
                                 ZEXT416((uint)local_148._40_4_));
      auVar28._8_4_ = 0x7fffffff;
      auVar28._0_8_ = 0x7fffffff7fffffff;
      auVar28._12_4_ = 0x7fffffff;
      auVar38 = vandps_avx512vl(auVar37,auVar28);
      fVar44 = (*(float *)(ctx + 8) + *(float *)(ctx + 0xc)) * 0.5 - auVar92._0_4_;
      auVar37 = vmovshdup_avx(auVar92);
      auVar40 = ZEXT416((uint)((*(float *)ctx + *(float *)(ctx + 4)) * 0.5 - fVar46));
      auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar44 * fVar44)),auVar40,auVar40);
      auVar37 = ZEXT416((uint)((*(float *)(ctx + 0x10) + *(float *)(ctx + 0x14)) * 0.5 -
                              auVar37._0_4_));
      auVar37 = vfmadd231ss_fma(auVar40,auVar37,auVar37);
      fVar46 = (float)local_148._80_4_ / (auVar38._0_4_ / auVar37._0_4_);
      if (ABS(fVar46) != INFINITY) {
        __return_storage_ptr__->set = local_f0;
        *(anon_struct_8_0_00000001_for___align *)&__return_storage_ptr__->optionalValue =
             local_148.__align;
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 8) =
             CONCAT44(local_148._12_4_,local_148._8_4_);
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x10) =
             CONCAT44(local_148._20_4_,local_148._16_4_);
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x18) =
             CONCAT44(local_148._28_4_,local_148._24_4_);
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = local_148._32_8_;
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x28) =
             CONCAT44(local_148._44_4_,local_148._40_4_);
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x30) =
             CONCAT44(local_148._52_4_,local_148._48_4_);
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = local_148._56_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = local_148._64_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = local_148._72_8_;
        *(float *)((long)&__return_storage_ptr__->optionalValue + 0x50) = fVar46;
        return __return_storage_ptr__;
      }
    }
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  }
  else {
    s = (Point3f *)(lVar15 + lVar35 * 0xc);
    if (((*(float *)(ctx + 0x24) != 0.0) || (*(float *)(ctx + 0x28) != 0.0)) ||
       ((NAN(*(float *)(ctx + 0x28)) ||
        ((*(float *)(ctx + 0x2c) != 0.0 || (NAN(*(float *)(ctx + 0x2c)))))))) {
      fVar46 = (*(float *)ctx + *(float *)(ctx + 4)) * 0.5;
      fVar44 = (*(float *)(ctx + 8) + *(float *)(ctx + 0xc)) * 0.5;
      fVar43 = (*(float *)(ctx + 0x10) + *(float *)(ctx + 0x14)) * 0.5;
      fVar45 = (s->super_Tuple3<pbrt::Point3,_float>).x - fVar46;
      fVar79 = (s->super_Tuple3<pbrt::Point3,_float>).y - fVar44;
      fVar17 = (s->super_Tuple3<pbrt::Point3,_float>).z - fVar43;
      local_68 = ZEXT416((uint)fVar79);
      local_78 = ZEXT416((uint)fVar45);
      auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar79 * fVar79)),local_78,ZEXT416((uint)fVar45));
      local_1e8 = ZEXT416((uint)fVar17);
      auVar37 = vfmadd231ss_fma(auVar37,local_1e8,ZEXT416((uint)fVar17));
      if (auVar37._0_4_ < 0.0) {
        auVar63._0_4_ = sqrtf(auVar37._0_4_);
        auVar63._4_60_ = extraout_var;
        local_168 = auVar63._0_16_;
      }
      else {
        local_168 = vsqrtss_avx(auVar37,auVar37);
      }
      local_98 = *(undefined8 *)(ctx + 0x24);
      uStack_90 = *(undefined8 *)(ctx + 0x2c);
      local_a8 = ZEXT416(*(uint *)(ctx + 0x28));
      local_b8 = ZEXT416(*(uint *)(ctx + 0x2c));
      fVar45 = pfVar1[1] - fVar44;
      local_1f8 = ZEXT416((uint)fVar45);
      local_1c8 = ZEXT416((uint)(*pfVar1 - fVar46));
      auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar45 * fVar45)),local_1c8,
                                ZEXT416((uint)(*pfVar1 - fVar46)));
      local_208 = ZEXT416((uint)(pfVar1[2] - fVar43));
      auVar37 = vfmadd231ss_fma(auVar37,local_208,ZEXT416((uint)(pfVar1[2] - fVar43)));
      if (auVar37._0_4_ < 0.0) {
        auVar64._0_4_ = sqrtf(auVar37._0_4_);
        auVar64._4_60_ = extraout_var_00;
        local_158 = auVar64._0_16_;
      }
      else {
        local_158 = vsqrtss_avx(auVar37,auVar37);
      }
      uStack_1d0 = *(undefined8 *)(ctx + 0x2c);
      local_1d8 = (float)*(undefined8 *)(ctx + 0x24);
      uStack_1d4 = (undefined4)((ulong)*(undefined8 *)(ctx + 0x24) >> 0x20);
      local_1b8 = ZEXT416(*(uint *)(ctx + 0x28));
      local_88 = ZEXT416(*(uint *)(ctx + 0x2c));
      fVar45 = *pfVar2 - fVar46;
      fVar79 = pfVar2[1] - fVar44;
      fVar17 = pfVar2[2] - fVar43;
      auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar79 * fVar79)),ZEXT416((uint)fVar45),
                                ZEXT416((uint)fVar45));
      auVar37 = vfmadd231ss_fma(auVar37,ZEXT416((uint)fVar17),ZEXT416((uint)fVar17));
      if (auVar37._0_4_ < 0.0) {
        local_c8 = ZEXT416((uint)fVar79);
        local_d8 = ZEXT416((uint)fVar17);
        local_e8 = ZEXT416((uint)fVar45);
        auVar65._0_4_ = sqrtf(auVar37._0_4_);
        auVar65._4_60_ = extraout_var_01;
        auVar37 = auVar65._0_16_;
        auVar40 = local_e8;
        auVar38 = local_c8;
        auVar39 = local_d8;
      }
      else {
        auVar37 = vsqrtss_avx(auVar37,auVar37);
        auVar40 = ZEXT416((uint)fVar45);
        auVar38 = ZEXT416((uint)fVar79);
        auVar39 = ZEXT416((uint)fVar17);
      }
      auVar91 = vinsertps_avx(local_168,auVar37,0x10);
      auVar37 = vinsertps_avx(local_78,auVar40,0x10);
      auVar37 = vdivps_avx(auVar37,auVar91);
      auVar40 = vinsertps_avx(local_68,auVar38,0x10);
      auVar40 = vdivps_avx(auVar40,auVar91);
      auVar38 = vinsertps_avx(local_1e8,auVar39,0x10);
      auVar38 = vdivps_avx(auVar38,auVar91);
      auVar39 = vinsertps_avx(local_b8,ZEXT416(*(uint *)(ctx + 0x2c)),0x10);
      auVar88._0_4_ = auVar38._0_4_ * auVar39._0_4_;
      auVar88._4_4_ = auVar38._4_4_ * auVar39._4_4_;
      auVar88._8_4_ = auVar38._8_4_ * auVar39._8_4_;
      auVar88._12_4_ = auVar38._12_4_ * auVar39._12_4_;
      auVar91 = vinsertps_avx(local_a8,ZEXT416(*(uint *)(ctx + 0x28)),0x10);
      auVar40 = vfmadd213ps_fma(auVar91,auVar40,auVar88);
      auVar38 = vfmsub213ps_fma(auVar38,auVar39,auVar88);
      auVar55._0_4_ = auVar40._0_4_ + auVar38._0_4_;
      auVar55._4_4_ = auVar40._4_4_ + auVar38._4_4_;
      auVar55._8_4_ = auVar40._8_4_ + auVar38._8_4_;
      auVar55._12_4_ = auVar40._12_4_ + auVar38._12_4_;
      auVar31._8_8_ = uStack_90;
      auVar31._0_8_ = local_98;
      auVar40 = vinsertps_avx(auVar31,ZEXT416(*(uint *)(ctx + 0x24)),0x10);
      auVar37 = vfmadd213ps_fma(auVar40,auVar37,auVar55);
      auVar24._8_4_ = 0x7fffffff;
      auVar24._0_8_ = 0x7fffffff7fffffff;
      auVar24._12_4_ = 0x7fffffff;
      auVar37 = vandps_avx512vl(auVar37,auVar24);
      auVar25._8_4_ = 0x3c23d70a;
      auVar25._0_8_ = 0x3c23d70a3c23d70a;
      auVar25._12_4_ = 0x3c23d70a;
      auVar40 = vmaxps_avx512vl(auVar37,auVar25);
      fVar46 = *pfVar3 - fVar46;
      fVar44 = pfVar3[1] - fVar44;
      fVar43 = pfVar3[2] - fVar43;
      auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar44 * fVar44)),ZEXT416((uint)fVar46),
                                ZEXT416((uint)fVar46));
      auVar37 = vfmadd231ss_fma(auVar37,ZEXT416((uint)fVar43),ZEXT416((uint)fVar43));
      if (auVar37._0_4_ < 0.0) {
        local_1e8 = ZEXT416((uint)fVar46);
        auVar66._0_4_ = sqrtf(auVar37._0_4_);
        auVar66._4_60_ = extraout_var_02;
        auVar37 = auVar66._0_16_;
        auVar38 = local_1e8;
      }
      else {
        auVar37 = vsqrtss_avx(auVar37,auVar37);
        auVar38 = ZEXT416((uint)fVar46);
      }
      auVar39 = vinsertps_avx(local_158,auVar37,0x10);
      auVar37 = vinsertps_avx(local_1c8,auVar38,0x10);
      auVar37 = vdivps_avx(auVar37,auVar39);
      auVar38 = vinsertps_avx(local_1f8,ZEXT416((uint)fVar44),0x10);
      auVar38 = vdivps_avx(auVar38,auVar39);
      auVar91 = vinsertps_avx(local_208,ZEXT416((uint)fVar43),0x10);
      auVar39 = vdivps_avx(auVar91,auVar39);
      auVar91 = vinsertps_avx(local_88,ZEXT416(*(uint *)(ctx + 0x2c)),0x10);
      auVar89._0_4_ = auVar39._0_4_ * auVar91._0_4_;
      auVar89._4_4_ = auVar39._4_4_ * auVar91._4_4_;
      auVar89._8_4_ = auVar39._8_4_ * auVar91._8_4_;
      auVar89._12_4_ = auVar39._12_4_ * auVar91._12_4_;
      auVar47 = vinsertps_avx(local_1b8,ZEXT416(*(uint *)(ctx + 0x28)),0x10);
      auVar38 = vfmadd213ps_fma(auVar47,auVar38,auVar89);
      auVar39 = vfmsub213ps_fma(auVar39,auVar91,auVar89);
      auVar56._0_4_ = auVar38._0_4_ + auVar39._0_4_;
      auVar56._4_4_ = auVar38._4_4_ + auVar39._4_4_;
      auVar56._8_4_ = auVar38._8_4_ + auVar39._8_4_;
      auVar56._12_4_ = auVar38._12_4_ + auVar39._12_4_;
      auVar29._4_4_ = uStack_1d4;
      auVar29._0_4_ = local_1d8;
      auVar29._8_8_ = uStack_1d0;
      auVar38 = vinsertps_avx(auVar29,ZEXT416(*(uint *)(ctx + 0x24)),0x10);
      auVar37 = vfmadd213ps_fma(auVar38,auVar37,auVar56);
      auVar26._8_4_ = 0x7fffffff;
      auVar26._0_8_ = 0x7fffffff7fffffff;
      auVar26._12_4_ = 0x7fffffff;
      auVar37 = vandps_avx512vl(auVar37,auVar26);
      auVar27._8_4_ = 0x3c23d70a;
      auVar27._0_8_ = 0x3c23d70a3c23d70a;
      auVar27._12_4_ = 0x3c23d70a;
      auVar39 = vmaxps_avx512vl(auVar37,auVar27);
      auVar93._8_8_ = 0;
      auVar93._0_4_ = local_210.x;
      auVar93._4_4_ = local_210.y;
      auVar37 = vmovshdup_avx(auVar93);
      auVar90._0_4_ = auVar40._0_4_ + auVar39._0_4_;
      auVar90._4_4_ = auVar40._4_4_ + auVar39._4_4_;
      auVar90._8_4_ = auVar40._8_4_ + auVar39._8_4_;
      auVar90._12_4_ = auVar40._12_4_ + auVar39._12_4_;
      auVar38 = vmovshdup_avx(auVar90);
      fVar43 = auVar38._0_4_;
      fVar44 = auVar37._0_4_;
      fVar46 = fVar44 * (auVar90._0_4_ + fVar43);
      auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar44 * fVar43 * fVar43)),
                                ZEXT416((uint)(auVar90._0_4_ * auVar90._0_4_)),
                                ZEXT416((uint)(1.0 - fVar44)));
      if (auVar37._0_4_ < 0.0) {
        local_208._0_4_ = fVar46;
        local_1f8 = auVar93;
        fVar44 = sqrtf(auVar37._0_4_);
        fVar46 = (float)local_208._0_4_;
        auVar93 = local_1f8;
      }
      else {
        auVar37 = vsqrtss_avx(auVar37,auVar37);
        fVar44 = auVar37._0_4_;
      }
      auVar37 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                           ZEXT416((uint)(fVar46 / (auVar90._0_4_ + fVar44))));
      fVar46 = auVar37._0_4_;
      fVar44 = 1.0 - fVar46;
      auVar38 = vmovshdup_avx(auVar40);
      auVar91 = vfmadd231ss_fma(ZEXT416((uint)(auVar38._0_4_ * fVar46)),ZEXT416((uint)fVar44),
                                auVar40);
      fVar43 = auVar91._0_4_;
      auVar91 = vmovshdup_avx(auVar39);
      auVar47 = vfmadd231ss_fma(ZEXT416((uint)(auVar91._0_4_ * fVar46)),ZEXT416((uint)fVar44),
                                auVar39);
      fVar45 = auVar47._0_4_;
      fVar79 = auVar93._0_4_;
      fVar46 = fVar79 * (fVar43 + fVar45);
      auVar47 = vfmadd231ss_fma(ZEXT416((uint)(fVar79 * fVar45 * fVar45)),
                                ZEXT416((uint)(fVar43 * fVar43)),ZEXT416((uint)(1.0 - fVar79)));
      if (auVar47._0_4_ < 0.0) {
        local_1b8._0_4_ = fVar43;
        local_1e8._0_4_ = fVar46;
        local_208 = auVar38;
        local_1f8 = auVar37;
        local_1d8 = fVar44;
        local_1c8 = auVar91;
        fVar45 = sqrtf(auVar47._0_4_);
        fVar44 = local_1d8;
        fVar43 = (float)local_1b8._0_4_;
        fVar46 = (float)local_1e8._0_4_;
        auVar38 = local_208;
        auVar91 = local_1c8;
        auVar37 = local_1f8;
      }
      else {
        auVar47 = vsqrtss_avx(auVar47,auVar47);
        fVar45 = auVar47._0_4_;
      }
      fVar79 = 0.0;
      auVar48 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                           ZEXT416((uint)(fVar46 / (fVar43 + fVar45))));
      auVar47 = vinsertps_avx(auVar48,auVar37,0x10);
      local_210 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar47);
      fVar46 = auVar48._0_4_;
      if ((((0.0 <= fVar46) && (fVar46 <= 1.0)) && (fVar43 = auVar37._0_4_, 0.0 <= fVar43)) &&
         (fVar43 <= 1.0)) {
        fVar45 = auVar91._0_4_ + auVar38._0_4_ + auVar90._0_4_;
        if ((fVar45 != 0.0) || (fVar79 = 1.0, NAN(fVar45))) {
          auVar37 = vfmadd231ss_fma(ZEXT416((uint)(auVar39._0_4_ * fVar44 * fVar46)),auVar40,
                                    ZEXT416((uint)(fVar44 * (1.0 - fVar46))));
          auVar37 = vfmadd213ss_fma(auVar38,ZEXT416((uint)(fVar43 * (1.0 - fVar46))),auVar37);
          auVar37 = vfmadd213ss_fma(auVar91,ZEXT416((uint)(fVar43 * fVar46)),auVar37);
          fVar79 = (auVar37._0_4_ * 4.0) / fVar45;
        }
      }
    }
    else {
      fVar79 = 1.0;
    }
    auVar37 = vinsertps_avx(*(undefined1 (*) [16])ctx,ZEXT416(*(uint *)(ctx + 0xc)),0x10);
    auVar57._0_4_ = (float)*(undefined8 *)(ctx + 4) + auVar37._0_4_;
    auVar57._4_4_ = (float)((ulong)*(undefined8 *)(ctx + 4) >> 0x20) + auVar37._4_4_;
    auVar57._8_4_ = auVar37._8_4_ + 0.0;
    auVar57._12_4_ = auVar37._12_4_ + 0.0;
    auVar23._8_4_ = 0x3f000000;
    auVar23._0_8_ = 0x3f0000003f000000;
    auVar23._12_4_ = 0x3f000000;
    auVar37 = vmulps_avx512vl(auVar57,auVar23);
    local_148._8_4_ = (*(float *)(ctx + 0x10) + *(float *)(ctx + 0x14)) * 0.5;
    local_148.__align = (anon_struct_8_0_00000001_for___align)vmovlps_avx(auVar37);
    auVar58._8_8_ = 0;
    auVar58._0_8_ = *(ulong *)pfVar1;
    uVar4 = (s->super_Tuple3<pbrt::Point3,_float>).x;
    uVar8 = (s->super_Tuple3<pbrt::Point3,_float>).y;
    auVar73._4_4_ = uVar8;
    auVar73._0_4_ = uVar4;
    auVar73._8_8_ = 0;
    auVar37 = vsubps_avx(auVar58,auVar73);
    local_40.z = pfVar1[2] - (s->super_Tuple3<pbrt::Point3,_float>).z;
    local_40._0_8_ = vmovlps_avx(auVar37);
    auVar59._8_8_ = 0;
    auVar59._0_8_ = *(ulong *)pfVar2;
    uVar5 = (s->super_Tuple3<pbrt::Point3,_float>).x;
    uVar9 = (s->super_Tuple3<pbrt::Point3,_float>).y;
    auVar74._4_4_ = uVar9;
    auVar74._0_4_ = uVar5;
    auVar74._8_8_ = 0;
    auVar37 = vsubps_avx(auVar59,auVar74);
    auVar68 = ZEXT856(auVar37._8_8_);
    local_50.z = pfVar2[2] - (s->super_Tuple3<pbrt::Point3,_float>).z;
    uVar77 = 0;
    uVar78 = 0;
    ey = &local_50;
    local_50._0_8_ = vmovlps_avx(auVar37);
    PVar96 = SampleSphericalRectangle
                       ((Point3f *)&local_148.__align,s,(Vector3f *)&local_40,(Vector3f *)ey,
                        (Point2f *)&local_210,&local_16c);
    uVar34 = (undefined4)((ulong)ey >> 0x20);
    local_1f8._0_4_ = PVar96.super_Tuple3<pbrt::Point3,_float>.z;
    auVar67._0_8_ = PVar96.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar67._8_56_ = auVar68;
    local_208 = auVar67._0_16_;
    auVar38 = vmovshdup_avx(local_208);
    fVar46 = PVar96.super_Tuple3<pbrt::Point3,_float>.x;
    auVar95._4_4_ = fVar46;
    auVar95._0_4_ = fVar46;
    auVar95._8_4_ = fVar46;
    auVar95._12_4_ = fVar46;
    auVar94._4_4_ = local_1f8._0_4_;
    auVar94._0_4_ = local_1f8._0_4_;
    auVar94._8_4_ = local_1f8._0_4_;
    auVar94._12_4_ = local_1f8._0_4_;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = *(ulong *)(pfVar1 + 1);
    uVar6 = (s->super_Tuple3<pbrt::Point3,_float>).y;
    uVar10 = (s->super_Tuple3<pbrt::Point3,_float>).z;
    auVar75._4_4_ = uVar10;
    auVar75._0_4_ = uVar6;
    auVar75._8_8_ = 0;
    auVar91 = vsubps_avx(auVar60,auVar75);
    auVar37 = vinsertps_avx(ZEXT416((uint)pfVar2[1]),ZEXT416((uint)*pfVar1),0x10);
    auVar39 = ZEXT416((uint)(s->super_Tuple3<pbrt::Point3,_float>).x);
    auVar40 = vinsertps_avx(auVar75,auVar39,0x10);
    auVar47 = vsubps_avx(auVar37,auVar40);
    auVar37 = vinsertps_avx(ZEXT416((uint)pfVar2[2]),ZEXT416((uint)*pfVar2),0x10);
    auVar40 = vpermi2ps_avx512vl(_DAT_00462af0,auVar75,auVar39);
    auVar40 = vsubps_avx(auVar37,auVar40);
    auVar37 = vpermi2ps_avx512vl(_DAT_00462b00,auVar40,auVar91);
    auVar83._0_4_ = auVar47._0_4_ * auVar37._0_4_;
    auVar83._4_4_ = auVar47._4_4_ * auVar37._4_4_;
    auVar83._8_4_ = auVar47._8_4_ * auVar37._8_4_;
    auVar83._12_4_ = auVar47._12_4_ * auVar37._12_4_;
    auVar37 = vinsertps_avx(auVar47,auVar40,0x1c);
    auVar39 = vmovshdup_avx(auVar40);
    auVar48 = vfmsub213ps_fma(auVar40,auVar91,auVar83);
    auVar40 = vinsertps_avx(auVar47,auVar91,0x4c);
    auVar37 = vfnmadd213ps_fma(auVar37,auVar40,auVar83);
    local_1c8._0_4_ = auVar48._0_4_ + auVar37._0_4_;
    local_1c8._4_4_ = auVar48._4_4_ + auVar37._4_4_;
    local_1c8._8_4_ = auVar48._8_4_ + auVar37._8_4_;
    local_1c8._12_4_ = auVar48._12_4_ + auVar37._12_4_;
    auVar37 = vmovshdup_avx(auVar47);
    auVar40 = ZEXT416((uint)(auVar91._0_4_ * auVar39._0_4_));
    auVar37 = vfmsub213ss_fma(auVar37,auVar47,auVar40);
    auVar40 = vfnmadd213ss_fma(auVar39,auVar91,auVar40);
    local_1d8 = auVar37._0_4_ + auVar40._0_4_;
    auVar61._0_4_ = local_1c8._0_4_ * local_1c8._0_4_;
    auVar61._4_4_ = local_1c8._4_4_ * local_1c8._4_4_;
    auVar61._8_4_ = local_1c8._8_4_ * local_1c8._8_4_;
    auVar61._12_4_ = local_1c8._12_4_ * local_1c8._12_4_;
    auVar37 = vmovshdup_avx(auVar61);
    auVar37 = vfmadd231ss_fma(auVar37,local_1c8,local_1c8);
    auVar37 = vfmadd231ss_fma(auVar37,ZEXT416((uint)local_1d8),ZEXT416((uint)local_1d8));
    if (auVar37._0_4_ < 0.0) {
      local_1f8._4_4_ = uVar77;
      local_1f8._8_4_ = 0;
      local_1f8._12_4_ = uVar78;
      fVar46 = sqrtf(auVar37._0_4_);
    }
    else {
      auVar37 = vsqrtss_avx(auVar37,auVar37);
      fVar46 = auVar37._0_4_;
    }
    auVar76._4_4_ = fVar46;
    auVar76._0_4_ = fVar46;
    auVar76._8_4_ = fVar46;
    auVar76._12_4_ = fVar46;
    auVar37 = vdivps_avx(local_1c8,auVar76);
    bVar32 = *pcVar13 == pcVar13[1];
    uVar36 = 0xff;
    if (!bVar32) {
      uVar36 = 0;
    }
    bVar16 = (bool)((byte)uVar36 & 1);
    auVar41._0_4_ = (uint)bVar16 * auVar37._0_4_ | (uint)!bVar16 * (auVar37._0_4_ ^ 0x80000000);
    bVar16 = (bool)((byte)(uVar36 >> 1) & 1);
    auVar41._4_4_ = (uint)bVar16 * auVar37._4_4_ | (uint)!bVar16 * (auVar37._4_4_ ^ 0x80000000);
    bVar16 = (bool)((byte)(uVar36 >> 2) & 1);
    auVar41._8_4_ = (uint)bVar16 * auVar37._8_4_ | (uint)!bVar16 * (auVar37._8_4_ ^ 0x80000000);
    bVar16 = (bool)((byte)(uVar36 >> 3) & 1);
    auVar41._12_4_ = (uint)bVar16 * auVar37._12_4_ | (uint)!bVar16 * (auVar37._12_4_ ^ 0x80000000);
    fVar44 = (s->super_Tuple3<pbrt::Point3,_float>).x;
    fVar43 = (s->super_Tuple3<pbrt::Point3,_float>).y;
    fVar17 = auVar38._0_4_ - fVar43;
    fVar45 = (s->super_Tuple3<pbrt::Point3,_float>).z;
    fVar18 = *pfVar1 - fVar44;
    fVar19 = pfVar1[1] - fVar43;
    fVar20 = pfVar1[2] - fVar45;
    auVar91 = ZEXT416((uint)(local_208._0_4_ - fVar44));
    auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar19 * fVar17)),auVar91,ZEXT416((uint)fVar18));
    auVar40 = vfmadd231ss_fma(auVar37,ZEXT416((uint)((float)local_1f8._0_4_ - fVar45)),
                              ZEXT416((uint)fVar20));
    auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar19 * fVar19)),ZEXT416((uint)fVar18),
                              ZEXT416((uint)fVar18));
    auVar39 = vfmadd231ss_fma(auVar37,ZEXT416((uint)fVar20),ZEXT416((uint)fVar20));
    fVar44 = *pfVar2 - fVar44;
    fVar43 = pfVar2[1] - fVar43;
    fVar18 = pfVar2[2] - fVar45;
    auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar17 * fVar43)),ZEXT416((uint)fVar44),auVar91);
    auVar91 = vfmadd231ss_fma(auVar37,ZEXT416((uint)fVar18),
                              ZEXT416((uint)((float)local_1f8._0_4_ - fVar45)));
    auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar43 * fVar43)),ZEXT416((uint)fVar44),
                              ZEXT416((uint)fVar44));
    auVar47 = vfmadd231ss_fma(auVar37,ZEXT416((uint)fVar18),ZEXT416((uint)fVar18));
    uVar77 = *(undefined4 *)(ctx + 0x30);
    __return_storage_ptr__->set = true;
    auVar37 = vmovlhps_avx(auVar95,auVar38);
    *(undefined1 (*) [16])&__return_storage_ptr__->optionalValue = auVar37;
    uVar7 = vmovlps_avx(auVar94);
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar7;
    *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = uVar77;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = 0;
    *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x24) = 0;
    uVar7 = vmovlps_avx(auVar41);
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = uVar7;
    *(uint *)((long)&__return_storage_ptr__->optionalValue + 0x30) =
         (uint)bVar32 * (int)(local_1d8 / fVar46) + (uint)!bVar32 * (int)-(local_1d8 / fVar46);
    *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x34) =
         CONCAT44(uVar34,auVar40._0_4_ / auVar39._0_4_) |
         (ulong)(uint)(auVar91._0_4_ / auVar47._0_4_) << 0x20;
    *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x3c) = ZEXT416(0) << 0x20
    ;
    *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x4c) = 0;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0x50) = fVar79 * local_16c;
  }
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<ShapeSample> BilinearPatch::Sample(const ShapeSampleContext &ctx,
                                                  Point2f u) const {
    // Get bilinear patch vertices in _p00_, _p01_, _p10_, and _p11_
    const BilinearPatchMesh *mesh = GetMesh();
    const int *v = &mesh->vertexIndices[4 * blpIndex];
    const Point3f &p00 = mesh->p[v[0]], &p10 = mesh->p[v[1]];
    const Point3f &p01 = mesh->p[v[2]], &p11 = mesh->p[v[3]];

    // Find normalized vectors to corners of bilinear patch
    Vector3f v00 = Normalize(p00 - ctx.p()), v10 = Normalize(p10 - ctx.p());
    Vector3f v01 = Normalize(p01 - ctx.p()), v11 = Normalize(p11 - ctx.p());

    if (IsRectangle() && !mesh->imageDistribution &&
        SphericalQuadArea(v00, v10, v11, v01) > MinSphericalSampleArea) {
        // Sample direction to rectanglular bilinear patch
        Float pdf = 1;
        if (ctx.ns != Normal3f(0, 0, 0)) {
            // Warp uniform sample _u_ to account for incident $\cos \theta$ factor
            // Compute $\cos \theta$ weights for rectangle seen from _ctx.p()_
            Point3f rp = ctx.p();
            pstd::array<Float, 4> w = pstd::array<Float, 4>{
                std::max<Float>(0.01, AbsDot(Normalize(p00 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p10 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p01 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p11 - rp), ctx.ns))};

            u = SampleBilinear(u, w);
            pdf *= BilinearPDF(u, w);
        }
        // Sample spherical rectangle at reference point $\pt{}$
        Float quadPDF;
        Point3f p =
            SampleSphericalRectangle(ctx.p(), p00, p10 - p00, p01 - p00, u, &quadPDF);
        pdf *= quadPDF;

        // Compute surface normal and $(u,v)$ for sampled point on rectangle
        Normal3f n = Normal3f(Normalize(Cross(p10 - p00, p01 - p00)));
        if (mesh->reverseOrientation ^ mesh->transformSwapsHandedness)
            n *= -1;
        Point2f uv(Dot(p - p00, p10 - p00) / DistanceSquared(p10, p00),
                   Dot(p - p00, p01 - p00) / DistanceSquared(p01, p00));

        return ShapeSample{Interaction(p, n, ctx.time, uv), pdf};

    } else {
        // Uniformly sample shape and compute incident direction _wi_
        pstd::optional<ShapeSample> ss = Sample(u);
        DCHECK(ss.has_value());
        ss->intr.time = ctx.time;
        Vector3f wi = ss->intr.p() - ctx.p();
        if (LengthSquared(wi) == 0)
            return {};
        wi = Normalize(wi);

        // Convert uniform area sample PDF in _ss_ to solid angle measure
        ss->pdf /= AbsDot(ss->intr.n, -wi) / DistanceSquared(ctx.p(), ss->intr.p());
        if (IsInf(ss->pdf))
            return {};

        return ss;
    }
}